

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

int ncnn::binary_op_broadcast_outer<ncnn::BinaryOp_x86_avx_functor::binary_op_min>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int *piVar5;
  long *in_RDX;
  binary_op_min *in_RSI;
  long *in_RDI;
  float fVar6;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar7 [32];
  undefined8 uVar12;
  undefined1 auVar8 [32];
  __m128 afVar13;
  int x_5;
  __m128 _outp_3;
  __m128 _b_3;
  __m128 _p_3;
  int x_4;
  __m256 _outp_2;
  __m256 _b_2;
  __m256 _p_2;
  int x_3;
  float *ptr1_1;
  int y1;
  int y_1;
  int z1;
  int z;
  float *outptr_1;
  float *ptr_1;
  int q;
  int x_2;
  __m128 _outp_1;
  __m128 _b_1;
  __m128 _p_1;
  int x_1;
  __m256 _outp;
  __m256 _b;
  __m256 _p;
  int x;
  float *outptr;
  float *ptr1;
  float *ptr;
  int y;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  binary_op_min op;
  Mat *m;
  Mat *m_1;
  undefined4 in_stack_fffffffffffff8e0;
  float in_stack_fffffffffffff8e4;
  binary_op_min *in_stack_fffffffffffff8e8;
  binary_op_min *this;
  binary_op_min *in_stack_fffffffffffff8f0;
  binary_op_min *this_00;
  int local_6a4;
  float local_690 [2];
  float afStack_688 [2];
  float local_680 [2];
  float afStack_678 [5];
  int local_664;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  int local_5f4;
  undefined8 local_5f0;
  undefined8 local_5e8;
  undefined8 local_5e0;
  undefined4 local_5d8;
  long local_5d0;
  undefined4 local_5c8;
  undefined4 local_5c4;
  undefined4 local_5c0;
  undefined4 local_5bc;
  undefined4 local_5b8;
  undefined8 local_5b0;
  float *local_5a8;
  int local_5a0;
  int local_59c;
  int local_598;
  int local_594;
  int local_590;
  int local_58c;
  undefined8 local_588;
  undefined8 local_580;
  undefined8 local_578;
  undefined4 local_570;
  long local_568;
  undefined4 local_560;
  undefined4 local_55c;
  undefined4 local_558;
  undefined4 local_554;
  undefined4 local_550;
  undefined8 local_548;
  undefined1 (*local_540) [32];
  undefined8 local_538;
  undefined8 local_530;
  undefined8 local_528;
  undefined4 local_520;
  long local_518;
  undefined4 local_510;
  undefined4 local_50c;
  undefined4 local_508;
  undefined4 local_504;
  undefined4 local_500;
  undefined8 local_4f8;
  float *local_4f0;
  int local_4e8;
  int local_4e4;
  undefined8 local_4e0;
  float afStack_4d8 [2];
  float local_4d0 [2];
  float afStack_4c8 [2];
  float local_4c0 [2];
  float afStack_4b8 [5];
  int local_4a4;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  int local_424;
  undefined1 (*local_420) [32];
  float *local_418;
  float *local_410;
  int local_404;
  int local_400;
  int local_3fc;
  int local_3f8;
  int local_3f4;
  int local_3f0;
  binary_op_min local_3e9 [9];
  long *local_3e0;
  binary_op_min *local_3d8;
  long *local_3d0;
  undefined1 local_3c5;
  int local_3c4;
  undefined8 *local_3b8;
  undefined8 *local_3b0;
  binary_op_min *local_3a8;
  undefined8 *local_398;
  undefined8 *local_390;
  undefined8 *local_388;
  undefined1 local_37d;
  int local_37c;
  undefined8 *local_370;
  undefined8 *local_360;
  float local_358;
  float local_354;
  float *local_350;
  float *local_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 (*local_308) [32];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined1 (*local_2c8) [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float local_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float local_28c;
  long local_288;
  undefined4 local_27c;
  long local_278;
  undefined1 (*local_270) [32];
  undefined4 local_264;
  int local_260;
  int local_25c;
  undefined8 *local_258;
  long local_250;
  undefined4 local_244;
  long local_240;
  float *local_238;
  undefined4 local_22c;
  int local_228;
  int local_224;
  undefined8 *local_220;
  undefined4 local_214;
  long local_210;
  undefined4 local_204;
  long local_200;
  undefined8 *local_1e0;
  undefined8 *local_1d0;
  undefined8 *local_1c0;
  undefined1 local_180 [32];
  float local_160;
  float local_15c;
  float local_158;
  float local_154;
  float local_150;
  float local_14c;
  float local_148;
  float local_144;
  undefined1 local_140 [32];
  float local_10c;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  int local_ec;
  undefined8 *local_e8;
  int local_dc;
  long *local_d8;
  int local_cc;
  long *local_c8;
  float *local_c0;
  float *local_b8;
  undefined8 local_b0;
  float afStack_a8 [4];
  undefined1 (*local_98) [32];
  undefined8 local_90;
  float afStack_88 [2];
  undefined1 (*local_80) [32];
  int local_74;
  undefined8 *local_68;
  long local_60;
  float local_54;
  long local_50;
  long local_48;
  float local_40;
  float local_3c;
  binary_op_min *local_38;
  
  local_3f0 = *(int *)((long)in_RDI + 0x2c);
  local_3f4 = (int)in_RDI[6];
  local_3f8 = *(int *)((long)in_RDI + 0x34);
  local_3fc = (int)in_RDI[7];
  local_400 = (int)in_RDI[3];
  local_3e0 = in_RDX;
  local_3d8 = in_RSI;
  local_3d0 = in_RDI;
  if ((int)in_RDI[5] == 2) {
    for (local_404 = 0; local_404 < local_3f4; local_404 = local_404 + 1) {
      local_d8 = local_3d0;
      local_dc = local_404;
      local_410 = (float *)(*local_3d0 +
                           (long)*(int *)((long)local_3d0 + 0x2c) * (long)local_404 * local_3d0[2]);
      local_3a8 = local_3d8;
      local_418 = *(float **)local_3d8;
      local_c8 = local_3e0;
      local_cc = local_404;
      local_420 = (undefined1 (*) [32])
                  (*local_3e0 +
                  (long)*(int *)((long)local_3e0 + 0x2c) * (long)local_404 * local_3e0[2]);
      if (local_400 == 8) {
        for (local_424 = 0; local_424 < local_3f0; local_424 = local_424 + 1) {
          local_348 = local_410;
          local_460 = *(undefined8 *)local_410;
          uStack_458 = *(undefined8 *)(local_410 + 2);
          uStack_450 = *(undefined8 *)(local_410 + 4);
          uStack_448 = *(undefined8 *)(local_410 + 6);
          local_354 = *local_418;
          auVar1 = vinsertps_avx(ZEXT416((uint)local_354),ZEXT416((uint)local_354),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_354),0x20);
          auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_354),0x30);
          auVar2 = vinsertps_avx(ZEXT416((uint)local_354),ZEXT416((uint)local_354),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_354),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_354),0x30);
          auVar7._16_16_ = auVar1;
          auVar7._0_16_ = auVar2;
          local_180._0_8_ = auVar2._0_8_;
          local_180._8_8_ = auVar2._8_8_;
          local_180._16_8_ = auVar1._0_8_;
          local_180._24_8_ = auVar1._8_8_;
          local_480 = local_180._0_8_;
          uStack_478 = local_180._8_8_;
          uStack_470 = local_180._16_8_;
          uStack_468 = local_180._24_8_;
          uVar9 = local_180._0_8_;
          uVar10 = local_180._8_8_;
          uVar11 = local_180._16_8_;
          uVar12 = local_180._24_8_;
          local_180 = auVar7;
          local_160 = local_354;
          local_15c = local_354;
          local_158 = local_354;
          local_154 = local_354;
          local_150 = local_354;
          local_14c = local_354;
          local_148 = local_354;
          local_144 = local_354;
          BinaryOp_x86_avx_functor::binary_op_min::func_pack8
                    (in_stack_fffffffffffff8f0,(__m256 *)in_stack_fffffffffffff8e8,
                     (__m256 *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
          local_2c8 = local_420;
          auVar4._8_8_ = uVar10;
          auVar4._0_8_ = uVar9;
          auVar4._16_8_ = uVar11;
          auVar4._24_8_ = uVar12;
          *local_420 = auVar4;
          local_410 = local_410 + 8;
          local_418 = local_418 + 1;
          local_420 = local_420 + 1;
          local_4a0 = uVar9;
          uStack_498 = uVar10;
          uStack_490 = uVar11;
          uStack_488 = uVar12;
          local_300 = uVar9;
          uStack_2f8 = uVar10;
          uStack_2f0 = uVar11;
          uStack_2e8 = uVar12;
        }
      }
      if (local_400 == 4) {
        for (local_4a4 = 0; local_4a4 < local_3f0; local_4a4 = local_4a4 + 1) {
          local_b8 = local_410;
          local_4c0 = *(float (*) [2])local_410;
          afStack_4b8._0_8_ = *(undefined8 *)(local_410 + 2);
          local_2a0 = *local_418;
          local_4d0[1] = local_2a0;
          local_4d0[0] = local_2a0;
          uVar9._4_4_ = local_2a0;
          uVar9._0_4_ = local_2a0;
          afStack_4c8 = (float  [2])uVar9;
          fStack_29c = local_2a0;
          fStack_298 = local_2a0;
          fStack_294 = local_2a0;
          local_28c = local_2a0;
          afVar13 = BinaryOp_x86_avx_functor::binary_op_min::func_pack4
                              (local_3e9,(__m128 *)local_4c0,(__m128 *)local_4d0);
          local_4e0 = afVar13._0_8_;
          local_80 = local_420;
          auVar1._8_4_ = (float)uVar9;
          auVar1._12_4_ = SUB84(uVar9,4);
          auVar1._0_8_ = local_4e0;
          *(undefined1 (*) [16])*local_420 = auVar1;
          local_410 = local_410 + 4;
          local_418 = local_418 + 1;
          local_420 = (undefined1 (*) [32])(*local_420 + 0x10);
          afStack_4d8 = (float  [2])uVar9;
          local_90 = local_4e0;
          afStack_88 = (float  [2])uVar9;
        }
      }
      if (local_400 == 1) {
        for (local_4e4 = 0; local_4e4 < local_3f0; local_4e4 = local_4e4 + 1) {
          fVar6 = BinaryOp_x86_avx_functor::binary_op_min::func
                            (in_stack_fffffffffffff8e8,
                             (float *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                             (float *)0x11c8168);
          *(float *)*local_420 = fVar6;
          local_410 = local_410 + 1;
          local_418 = local_418 + 1;
          local_420 = (undefined1 (*) [32])(*local_420 + 4);
        }
      }
    }
  }
  if (((int)local_3d0[5] == 3) || ((int)local_3d0[5] == 4)) {
    for (local_4e8 = 0; local_4e8 < local_3fc; local_4e8 = local_4e8 + 1) {
      local_3b8 = &local_538;
      local_224 = *(int *)((long)local_3d0 + 0x2c);
      local_228 = (int)local_3d0[6];
      local_22c = *(undefined4 *)((long)local_3d0 + 0x34);
      local_4f0 = (float *)(*local_3d0 + local_3d0[8] * (long)local_4e8 * local_3d0[2]);
      local_240 = local_3d0[2];
      local_244 = (undefined4)local_3d0[3];
      local_250 = local_3d0[4];
      local_220 = &local_538;
      local_210 = (long)local_224 * (long)local_228 * local_240;
      local_3b0 = &local_538;
      local_398 = &local_538;
      local_370 = &local_588;
      local_25c = *(int *)((long)local_3e0 + 0x2c);
      local_260 = (int)local_3e0[6];
      local_264 = *(undefined4 *)((long)local_3e0 + 0x34);
      local_540 = (undefined1 (*) [32])(*local_3e0 + local_3e0[8] * (long)local_4e8 * local_3e0[2]);
      local_278 = local_3e0[2];
      local_27c = (undefined4)local_3e0[3];
      local_288 = local_3e0[4];
      local_258 = &local_588;
      local_200 = (long)local_25c * (long)local_260 * local_278;
      local_360 = &local_588;
      local_390 = &local_588;
      local_500 = 0;
      local_504 = 0;
      local_508 = 0;
      local_50c = 0;
      local_520 = 0;
      local_528 = 0;
      local_530 = 0;
      local_538 = 0;
      local_204 = 0x10;
      local_214 = 0x10;
      local_37c = local_4e8;
      local_37d = 1;
      local_3c4 = local_4e8;
      local_3c5 = 1;
      local_4f8 = 0;
      local_510 = 0;
      local_588 = 0;
      local_578 = 0;
      local_570 = 0;
      local_560 = 0;
      local_55c = 0;
      local_558 = 0;
      local_554 = 0;
      local_550 = 0;
      local_548 = 0;
      local_580 = 0;
      local_270 = local_540;
      local_238 = local_4f0;
      local_1d0 = local_390;
      local_1c0 = local_398;
      local_568 = local_288;
      local_518 = local_250;
      for (local_58c = 0; local_58c < local_3f8; local_58c = local_58c + 1) {
        local_594 = (int)*(float *)(local_3d8 + 0x34) + -1;
        piVar5 = std::min<int>(&local_58c,&local_594);
        local_590 = *piVar5;
        for (local_598 = 0; local_598 < local_3f4; local_598 = local_598 + 1) {
          local_5a0 = (int)*(float *)(local_3d8 + 0x30) + -1;
          piVar5 = std::min<int>(&local_598,&local_5a0);
          local_59c = *piVar5;
          local_68 = &local_5f0;
          local_3c = *(float *)(local_3d8 + 0x2c);
          local_40 = *(float *)(local_3d8 + 0x30);
          local_48 = *(long *)local_3d8 +
                     (long)(int)*(float *)(local_3d8 + 0x2c) *
                     (long)(int)*(float *)(local_3d8 + 0x30) * (long)local_590 *
                     *(long *)(local_3d8 + 0x10);
          local_50 = *(long *)(local_3d8 + 0x10);
          local_54 = *(float *)(local_3d8 + 0x18);
          local_60 = *(long *)(local_3d8 + 0x20);
          this_00 = (binary_op_min *)&local_5f0;
          local_e8 = &local_5f0;
          local_5a8 = (float *)(local_48 + (long)(int)local_3c * (long)local_59c * local_50);
          local_388 = &local_5f0;
          local_74 = local_590;
          local_5f0 = 0;
          local_5e0 = 0;
          local_5d8 = 0;
          local_5c8 = 0;
          local_5c4 = 0;
          local_5c0 = 0;
          local_5bc = 0;
          local_5b8 = 0;
          local_5b0 = 0;
          local_5e8 = 0;
          this = local_3d8;
          local_1e0 = local_388;
          local_ec = local_59c;
          local_38 = this_00;
          local_5d0 = local_60;
          if (local_400 == 8) {
            for (local_5f4 = 0; local_5f4 < local_3f0; local_5f4 = local_5f4 + 1) {
              local_350 = local_4f0;
              local_620 = *(undefined8 *)local_4f0;
              uStack_618 = *(undefined8 *)(local_4f0 + 2);
              uStack_610 = *(undefined8 *)(local_4f0 + 4);
              uStack_608 = *(undefined8 *)(local_4f0 + 6);
              in_stack_fffffffffffff8e4 = *local_5a8;
              auVar1 = vinsertps_avx(ZEXT416((uint)in_stack_fffffffffffff8e4),
                                     ZEXT416((uint)in_stack_fffffffffffff8e4),0x10);
              auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)in_stack_fffffffffffff8e4),0x20);
              auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)in_stack_fffffffffffff8e4),0x30);
              auVar2 = vinsertps_avx(ZEXT416((uint)in_stack_fffffffffffff8e4),
                                     ZEXT416((uint)in_stack_fffffffffffff8e4),0x10);
              auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)in_stack_fffffffffffff8e4),0x20);
              auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)in_stack_fffffffffffff8e4),0x30);
              auVar8._16_16_ = auVar1;
              auVar8._0_16_ = auVar2;
              local_140._0_8_ = auVar2._0_8_;
              local_140._8_8_ = auVar2._8_8_;
              local_140._16_8_ = auVar1._0_8_;
              local_140._24_8_ = auVar1._8_8_;
              local_640 = local_140._0_8_;
              uStack_638 = local_140._8_8_;
              uStack_630 = local_140._16_8_;
              uStack_628 = local_140._24_8_;
              uVar9 = local_140._0_8_;
              uVar10 = local_140._8_8_;
              uVar11 = local_140._16_8_;
              uVar12 = local_140._24_8_;
              local_358 = in_stack_fffffffffffff8e4;
              local_140 = auVar8;
              local_10c = in_stack_fffffffffffff8e4;
              local_108 = in_stack_fffffffffffff8e4;
              local_104 = in_stack_fffffffffffff8e4;
              local_100 = in_stack_fffffffffffff8e4;
              local_fc = in_stack_fffffffffffff8e4;
              local_f8 = in_stack_fffffffffffff8e4;
              local_f4 = in_stack_fffffffffffff8e4;
              local_f0 = in_stack_fffffffffffff8e4;
              BinaryOp_x86_avx_functor::binary_op_min::func_pack8
                        (this_00,(__m256 *)this,
                         (__m256 *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
              local_308 = local_540;
              auVar3._8_8_ = uVar10;
              auVar3._0_8_ = uVar9;
              auVar3._16_8_ = uVar11;
              auVar3._24_8_ = uVar12;
              *local_540 = auVar3;
              local_4f0 = local_4f0 + 8;
              local_5a8 = local_5a8 + 1;
              local_540 = local_540 + 1;
              local_660 = uVar9;
              uStack_658 = uVar10;
              uStack_650 = uVar11;
              uStack_648 = uVar12;
              local_340 = uVar9;
              uStack_338 = uVar10;
              uStack_330 = uVar11;
              uStack_328 = uVar12;
            }
          }
          if (local_400 == 4) {
            for (local_664 = 0; local_664 < local_3f0; local_664 = local_664 + 1) {
              local_c0 = local_4f0;
              local_680 = *(float (*) [2])local_4f0;
              afStack_678._0_8_ = *(undefined8 *)(local_4f0 + 2);
              local_2c0 = *local_5a8;
              local_690[1] = local_2c0;
              local_690[0] = local_2c0;
              uVar10._4_4_ = local_2c0;
              uVar10._0_4_ = local_2c0;
              afStack_688 = (float  [2])uVar10;
              fStack_2bc = local_2c0;
              fStack_2b8 = local_2c0;
              fStack_2b4 = local_2c0;
              local_2a4 = local_2c0;
              afVar13 = BinaryOp_x86_avx_functor::binary_op_min::func_pack4
                                  (local_3e9,(__m128 *)local_680,(__m128 *)local_690);
              local_b0 = afVar13._0_8_;
              local_98 = local_540;
              auVar2._8_4_ = (float)uVar10;
              auVar2._12_4_ = SUB84(uVar10,4);
              auVar2._0_8_ = local_b0;
              *(undefined1 (*) [16])*local_540 = auVar2;
              local_4f0 = local_4f0 + 4;
              local_5a8 = local_5a8 + 1;
              local_540 = (undefined1 (*) [32])(*local_540 + 0x10);
              afStack_a8._0_8_ = uVar10;
            }
          }
          if (local_400 == 1) {
            for (local_6a4 = 0; local_6a4 < local_3f0; local_6a4 = local_6a4 + 1) {
              fVar6 = BinaryOp_x86_avx_functor::binary_op_min::func
                                (this,(float *)CONCAT44(in_stack_fffffffffffff8e4,
                                                        in_stack_fffffffffffff8e0),
                                 (float *)0x11c9121);
              *(float *)*local_540 = fVar6;
              local_4f0 = local_4f0 + 1;
              local_5a8 = local_5a8 + 1;
              local_540 = (undefined1 (*) [32])(*local_540 + 4);
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static int binary_op_broadcast_outer(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;

    if (a.dims == 2)
    {
        // type 14
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; y++)
        {
            const float* ptr = a.row(y);
            const float* ptr1 = b;
            float* outptr = c.row(y);

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (elempack == 16)
            {
                for (int x = 0; x < w; x++)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _b = _mm512_set1_ps(*ptr1);
                    __m512 _outp = op.func_pack16(_p, _b);
                    _mm512_storeu_ps(outptr, _outp);
                    ptr += 16;
                    ptr1 += 1;
                    outptr += 16;
                }
            }
#endif // __AVX512F__
            if (elempack == 8)
            {
                for (int x = 0; x < w; x++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _b = _mm256_set1_ps(*ptr1);
                    __m256 _outp = op.func_pack8(_p, _b);
                    _mm256_storeu_ps(outptr, _outp);
                    ptr += 8;
                    ptr1 += 1;
                    outptr += 8;
                }
            }
#endif // __AVX__
            if (elempack == 4)
            {
                for (int x = 0; x < w; x++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _b = _mm_set1_ps(*ptr1);
                    __m128 _outp = op.func_pack4(_p, _b);
                    _mm_storeu_ps(outptr, _outp);
                    ptr += 4;
                    ptr1 += 1;
                    outptr += 4;
                }
            }
#endif // __SSE2__
            if (elempack == 1)
            {
                for (int x = 0; x < w; x++)
                {
                    *outptr = op.func(*ptr, *ptr1);
                    ptr += 1;
                    ptr1 += 1;
                    outptr += 1;
                }
            }
        }
    }

    if (a.dims == 3 || a.dims == 4)
    {
        // type 15 16 17 18 19
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            float* outptr = c.channel(q);

            for (int z = 0; z < d; z++)
            {
                int z1 = std::min(z, b.d - 1);
                for (int y = 0; y < h; y++)
                {
                    int y1 = std::min(y, b.h - 1);

                    const float* ptr1 = b.depth(z1).row(y1);

#if __SSE2__
#if __AVX__
#if __AVX512F__
                    if (elempack == 16)
                    {
                        for (int x = 0; x < w; x++)
                        {
                            __m512 _p = _mm512_loadu_ps(ptr);
                            __m512 _b = _mm512_set1_ps(*ptr1);
                            __m512 _outp = op.func_pack16(_p, _b);
                            _mm512_storeu_ps(outptr, _outp);
                            ptr += 16;
                            ptr1 += 1;
                            outptr += 16;
                        }
                    }
#endif // __AVX512F__
                    if (elempack == 8)
                    {
                        for (int x = 0; x < w; x++)
                        {
                            __m256 _p = _mm256_loadu_ps(ptr);
                            __m256 _b = _mm256_set1_ps(*ptr1);
                            __m256 _outp = op.func_pack8(_p, _b);
                            _mm256_storeu_ps(outptr, _outp);
                            ptr += 8;
                            ptr1 += 1;
                            outptr += 8;
                        }
                    }
#endif // __AVX__
                    if (elempack == 4)
                    {
                        for (int x = 0; x < w; x++)
                        {
                            __m128 _p = _mm_loadu_ps(ptr);
                            __m128 _b = _mm_set1_ps(*ptr1);
                            __m128 _outp = op.func_pack4(_p, _b);
                            _mm_storeu_ps(outptr, _outp);
                            ptr += 4;
                            ptr1 += 1;
                            outptr += 4;
                        }
                    }
#endif // __SSE2__
                    if (elempack == 1)
                    {
                        for (int x = 0; x < w; x++)
                        {
                            *outptr = op.func(*ptr, *ptr1);
                            ptr += 1;
                            ptr1 += 1;
                            outptr += 1;
                        }
                    }
                }
            }
        }
    }

    return 0;
}